

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMatrix(AsciiParser *this,matrix2d *result)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  ulong local_a8;
  size_t i;
  string local_80 [32];
  string local_60;
  undefined4 local_3c;
  undefined1 local_38 [8];
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> content;
  matrix2d *result_local;
  AsciiParser *this_local;
  
  content.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)result;
  bVar1 = Expect(this,'(');
  if (bVar1) {
    ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               local_38);
    bVar1 = SepBy1TupleType<double,2ul>
                      (this,',',(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                 *)local_38);
    if (bVar1) {
      sVar2 = ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
              size((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   local_38);
      if (sVar2 == 2) {
        bVar1 = Expect(this,')');
        if (bVar1) {
          for (local_a8 = 0; local_a8 < 2; local_a8 = local_a8 + 1) {
            pvVar3 = ::std::
                     vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                     operator[]((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                 *)local_38,local_a8);
            pvVar4 = ::std::array<double,_2UL>::operator[](pvVar3,0);
            content.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[local_a8]._M_elems[0] = *pvVar4;
            pvVar3 = ::std::
                     vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                     operator[]((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                 *)local_38,local_a8);
            pvVar4 = ::std::array<double,_2UL>::operator[](pvVar3,1);
            content.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[local_a8]._M_elems[1] = *pvVar4;
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        sVar2 = ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                size((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_38);
        std::__cxx11::to_string((__cxx11 *)&i,sVar2);
        ::std::operator+((char *)local_80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "# of rows in matrix2d must be 2, but got ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_60,(char *)local_80);
        PushError(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        ::std::__cxx11::string::~string(local_80);
        ::std::__cxx11::string::~string((string *)&i);
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    local_3c = 1;
    ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               local_38);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParseMatrix(value::matrix2d *result) {

  if (!Expect('(')) {
    return false;
  }

  std::vector<std::array<double, 2>> content;
  if (!SepBy1TupleType<double, 2>(',', &content)) {
    return false;
  }

  if (content.size() != 2) {
    PushError("# of rows in matrix2d must be 2, but got " +
              std::to_string(content.size()) + "\n");
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  for (size_t i = 0; i < 2; i++) {
    result->m[i][0] = content[i][0];
    result->m[i][1] = content[i][1];
  }

  return true;
}